

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void tryfuncTM(lua_State *L,StkId func)

{
  undefined4 uVar1;
  TValue *pTVar2;
  TValue *io1_1;
  TValue *io1;
  StkId p;
  TValue *tm;
  StkId func_local;
  lua_State *L_local;
  
  pTVar2 = luaT_gettmbyobj(L,func,TM_CALL);
  if ((pTVar2->tt_ & 0xfU) != 6) {
    luaG_typeerror(L,func,"call");
  }
  for (io1 = L->top; func < io1; io1 = io1 + -1) {
    io1->value_ = io1[-1].value_;
    uVar1 = *(undefined4 *)&io1[-1].field_0xc;
    io1->tt_ = io1[-1].tt_;
    *(undefined4 *)&io1->field_0xc = uVar1;
  }
  L->top = L->top + 1;
  func->value_ = pTVar2->value_;
  uVar1 = *(undefined4 *)&pTVar2->field_0xc;
  func->tt_ = pTVar2->tt_;
  *(undefined4 *)&func->field_0xc = uVar1;
  return;
}

Assistant:

static void tryfuncTM (lua_State *L, StkId func) {
  const TValue *tm = luaT_gettmbyobj(L, func, TM_CALL);
  StkId p;
  if (!ttisfunction(tm))
    luaG_typeerror(L, func, "call");
  /* Open a hole inside the stack at 'func' */
  for (p = L->top; p > func; p--)
    setobjs2s(L, p, p-1);
  L->top++;  /* slot ensured by caller */
  setobj2s(L, func, tm);  /* tag method is the new function to be called */
}